

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

void VmPopOperand(jx9_value **ppTos,sxi32 nPop)

{
  jx9_value *pObj;
  
  pObj = *ppTos;
  for (; 0 < nPop; nPop = nPop + -1) {
    jx9MemObjRelease(pObj);
    pObj = pObj + -1;
  }
  *ppTos = pObj;
  return;
}

Assistant:

static void VmPopOperand(
	jx9_value **ppTos, /* Operand stack */
	sxi32 nPop         /* Total number of memory objects to pop */
	)
{
	jx9_value *pTos = *ppTos;
	while( nPop > 0 ){
		jx9MemObjRelease(pTos);
		pTos--;
		nPop--;
	}
	/* Top of the stack */
	*ppTos = pTos;
}